

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSDist_COF.cpp
# Opt level: O2

void __thiscall FSDist_COF::FSDist_COF(FSDist_COF *this,MADPComponentFactoredStates *a)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  size_type __n;
  uint sf;
  size_t sVar1;
  size_t *psVar2;
  ulong uVar3;
  allocator_type local_59;
  FSDist_COF *local_58;
  value_type_conflict3 local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  this_00 = &this->_m_sfacDomainSizes;
  (this->super_FactoredStateDistribution).super_StateDistribution._vptr_StateDistribution =
       (_func_int **)&PTR__FSDist_COF_0061e310;
  __n = a->_m_nrStateFactors;
  this->_m_nrStateFactors = __n;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (this_00,__n,(allocator_type *)&local_48);
  local_58 = this;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->_m_probs,a->_m_nrStateFactors,(allocator_type *)&local_48);
  for (sf = 0; uVar3 = (ulong)sf, uVar3 < a->_m_nrStateFactors; sf = sf + 1) {
    sVar1 = MADPComponentFactoredStates::GetNrValuesForFactor(a,sf);
    (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar3] = sVar1;
    sVar1 = MADPComponentFactoredStates::GetNrValuesForFactor(a,sf);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,sVar1,&local_50,&local_59);
    std::vector<double,_std::allocator<double>_>::_M_move_assign
              ((this->_m_probs).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3,&local_48);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  psVar2 = IndexTools::CalculateStepSize(this_00);
  local_58->_m_stepSize = psVar2;
  return;
}

Assistant:

FSDist_COF::FSDist_COF(const MADPComponentFactoredStates& a) :
    _m_nrStateFactors(a.GetNrStateFactors()),
    _m_sfacDomainSizes(a.GetNrStateFactors()),
    _m_probs(a.GetNrStateFactors())
{
    for(Index i=0; i < a.GetNrStateFactors(); i++)
    {
        _m_sfacDomainSizes[i] = a.GetNrValuesForFactor(i);
        _m_probs[i] = vector<double>( a.GetNrValuesForFactor( i ), 0.0 );
    }
    _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
}